

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void __thiscall QCss::ValueExtractor::lengthValues(ValueExtractor *this,Declaration *decl,int *m)

{
  bool bVar1;
  int iVar2;
  rvalue_ref t;
  DeclarationData *pDVar3;
  qsizetype asize;
  Promoted<long_long,_int> PVar4;
  LengthData *in_RDX;
  QVariant *in_RDI;
  long in_FS_OFFSET;
  LengthData LVar5;
  int i;
  int i_1;
  QList<QVariant> v;
  LengthData zero;
  QList<QVariant> v_1;
  LengthData datas [4];
  qsizetype in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffee8;
  int iVar6;
  undefined4 in_stack_fffffffffffffeec;
  QList<QVariant> *this_00;
  Value *in_stack_ffffffffffffff10;
  ValueExtractor *in_stack_ffffffffffffff18;
  qreal local_e0;
  undefined8 local_d8;
  qreal local_d0;
  anon_enum_32 local_c8;
  undefined4 uStack_c4;
  int local_bc;
  QVariant local_88;
  QVariant local_68;
  qreal local_48 [4];
  qreal local_28;
  undefined8 local_20;
  qreal local_18;
  undefined8 local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
            ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2dabf);
  bVar1 = ::QVariant::isValid(in_RDI);
  if (bVar1) {
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2db0b);
    ::QVariant::toList();
    for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
      QList<QVariant>::at((QList<QVariant> *)in_RDI,in_stack_fffffffffffffed8);
      qvariant_cast<QCss::LengthData>((QVariant *)in_RDX);
      iVar2 = lengthValueFromData(in_RDX,(QFont *)CONCAT44(iVar6,in_stack_fffffffffffffee8));
      *(int *)((long)&((Private *)&in_RDX->number)->data + (long)iVar6 * 4) = iVar2;
    }
    QList<QVariant>::~QList((QList<QVariant> *)0xa2db91);
  }
  else {
    memcpy(local_48,&DAT_00bed5c0,0x40);
    iVar6 = 0;
    while( true ) {
      t = (rvalue_ref)(long)iVar6;
      pDVar3 = QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                         ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)
                          0xa2dbd2);
      asize = QList<QCss::Value>::size(&pDVar3->values);
      local_bc = 4;
      PVar4 = qMin<long_long,int>((longlong *)&stack0xffffffffffffff48,&local_bc);
      if (PVar4 <= (long)t) break;
      QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
                ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2dc10);
      QList<QCss::Value>::operator[]((QList<QCss::Value> *)in_RDI,(qsizetype)t);
      LVar5 = lengthValue(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
      local_d0 = LVar5.number;
      local_c8 = LVar5.unit;
      local_48[(long)iVar6 * 2] = local_d0;
      local_48[(long)iVar6 * 2 + 1] = (qreal)CONCAT44(uStack_c4,local_c8);
      iVar6 = iVar6 + 1;
    }
    if (iVar6 == 0) {
      memset(&local_e0,0,0x10);
      local_18 = local_e0;
      local_10 = local_d8;
      local_28 = local_e0;
      local_20 = local_d8;
      local_48[2] = local_e0;
      local_48[3] = (qreal)local_d8;
      local_48[0] = local_e0;
      local_48[1] = (qreal)local_d8;
    }
    else if (iVar6 == 1) {
      local_48[2] = local_48[0];
      local_48[3] = local_48[1];
      local_28 = local_48[0];
      local_20 = local_48[1];
      local_18 = local_48[0];
      local_10 = local_48[1];
    }
    else if (iVar6 == 2) {
      local_28 = local_48[0];
      local_20 = local_48[1];
      local_18 = local_48[2];
      local_10 = local_48[3];
    }
    else if (iVar6 == 3) {
      local_18 = local_48[2];
      local_10 = local_48[3];
    }
    this_00 = (QList<QVariant> *)&DAT_aaaaaaaaaaaaaaaa;
    QList<QVariant>::QList((QList<QVariant> *)0xa2de15);
    QList<QVariant>::reserve(this_00,asize);
    for (iVar6 = 0; iVar6 < 4; iVar6 = iVar6 + 1) {
      ::QVariant::fromValue<QCss::LengthData>
                ((LengthData *)CONCAT44(in_stack_fffffffffffffeec,iVar6));
      QList<QVariant>::operator+=((QList<QVariant> *)in_RDI,t);
      ::QVariant::~QVariant(&local_68);
      iVar2 = lengthValueFromData(in_RDX,(QFont *)CONCAT44(in_stack_fffffffffffffeec,iVar6));
      *(int *)((long)&((Private *)&in_RDX->number)->data + (long)iVar6 * 4) = iVar2;
    }
    ::QVariant::QVariant(&local_88,(QList_conflict3 *)&stack0xffffffffffffff08);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::operator->
              ((QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData> *)0xa2ded4);
    ::QVariant::operator=((QVariant *)CONCAT44(in_stack_fffffffffffffeec,iVar6),in_RDI);
    ::QVariant::~QVariant(&local_88);
    QList<QVariant>::~QList((QList<QVariant> *)0xa2deff);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void ValueExtractor::lengthValues(const Declaration &decl, int *m)
{
    if (decl.d->parsed.isValid()) {
        QList<QVariant> v = decl.d->parsed.toList();
        Q_ASSERT(v.size() == 4);
        for (int i = 0; i < 4; i++)
            m[i] = lengthValueFromData(qvariant_cast<LengthData>(v.at(i)), f);
        return;
    }

    LengthData datas[4];
    int i;
    for (i = 0; i < qMin(decl.d->values.size(), 4); i++)
        datas[i] = lengthValue(decl.d->values[i]);

    if (i == 0) {
        LengthData zero = {0.0, LengthData::None};
        datas[0] = datas[1] = datas[2] = datas[3] = zero;
    } else if (i == 1) {
        datas[3] = datas[2] = datas[1] = datas[0];
    } else if (i == 2) {
        datas[2] = datas[0];
        datas[3] = datas[1];
    } else if (i == 3) {
        datas[3] = datas[1];
    }

    QList<QVariant> v;
    v.reserve(4);
    for (i = 0; i < 4; i++) {
        v += QVariant::fromValue<LengthData>(datas[i]);
        m[i] = lengthValueFromData(datas[i], f);
    }
    decl.d->parsed = v;
}